

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rejectEnter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxId enterId,
             number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *enterTest,Status enterStat)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar10;
  int32_t iVar11;
  int iVar12;
  long lVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  DataKey local_28;
  
  pLVar10 = &(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  if (0 < enterId.super_DataKey.info) {
    pLVar10 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
  }
  local_28 = enterId.super_DataKey;
  iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           ::number(&(pLVar10->
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).set,&local_28);
  local_28.info = this->theRep * local_28.info;
  lVar13 = (long)iVar12;
  pVVar14 = &this->theCoTest;
  if (0 < local_28.info) {
    pVVar14 = &this->theTest;
  }
  pnVar2 = (pVVar14->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
  uVar4 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
  uVar5 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
  uVar6 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
  uVar7 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 10);
  uVar8 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xc);
  uVar9 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 0xe);
  *(undefined8 *)&pnVar2[lVar13].m_backend.data =
       *(undefined8 *)(enterTest->m_backend).data._M_elems;
  *(undefined8 *)((long)&pnVar2[lVar13].m_backend.data + 8) = uVar3;
  puVar1 = (uint *)((long)&pnVar2[lVar13].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar4;
  *(undefined8 *)(puVar1 + 2) = uVar5;
  puVar1 = (uint *)((long)&pnVar2[lVar13].m_backend.data + 0x20);
  *(undefined8 *)puVar1 = uVar6;
  *(undefined8 *)(puVar1 + 2) = uVar7;
  puVar1 = (uint *)((long)&pnVar2[lVar13].m_backend.data + 0x30);
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar9;
  pnVar2[lVar13].m_backend.exp = (enterTest->m_backend).exp;
  pnVar2[lVar13].m_backend.neg = (enterTest->m_backend).neg;
  iVar11 = (enterTest->m_backend).prec_elem;
  pnVar2[lVar13].m_backend.fpclass = (enterTest->m_backend).fpclass;
  pnVar2[lVar13].m_backend.prec_elem = iVar11;
  *(Status *)
   (*(long *)(*(long *)((this->objLimit).m_backend.data._M_elems +
                       (ulong)(local_28.info < 1) * 2 + -0x1a) + 8) + lVar13 * 4) = enterStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectEnter(
   SPxId enterId,
   R enterTest,
   typename SPxBasisBase<R>::Desc::Status enterStat
)
{
   int enterIdx = this->number(enterId);

   if(isId(enterId))
   {
      theTest[enterIdx] = enterTest;
      this->desc().status(enterIdx) = enterStat;
   }
   else
   {
      theCoTest[enterIdx] = enterTest;
      this->desc().coStatus(enterIdx) = enterStat;
   }
}